

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree.cpp
# Opt level: O0

void __thiscall
b_tree::_insert_atomic_recursive(b_tree *this,int64_t key,int64_t value,int64_t node_ofs)

{
  int iVar1;
  bool bVar2;
  uint16_t uVar3;
  int64_t iVar4;
  undefined1 local_108 [8];
  b_tree_node child;
  int i;
  undefined1 local_90 [8];
  b_tree_node node;
  int64_t node_ofs_local;
  int64_t value_local;
  int64_t key_local;
  b_tree *this_local;
  
  node._child_ofs_field = (int64_t *)node_ofs;
  b_tree_node::b_tree_node((b_tree_node *)local_90,&this->_p,node_ofs);
  iVar4 = b_tree_node::_ofs((b_tree_node *)local_90);
  printf("%ld ",iVar4);
  bVar2 = b_tree_node::_leaf((b_tree_node *)local_90);
  if (bVar2) {
    b_tree_node::_insert_non_full((b_tree_node *)local_90,key,value);
  }
  else {
    child._child_ofs_field._0_4_ = 0;
    while( true ) {
      iVar1 = (int)child._child_ofs_field;
      uVar3 = b_tree_node::_num_keys((b_tree_node *)local_90);
      bVar2 = false;
      if (iVar1 < (int)(uint)uVar3) {
        iVar4 = b_tree_node::_key((b_tree_node *)local_90,(uint16_t)child._child_ofs_field);
        bVar2 = iVar4 < key;
      }
      if (!bVar2) break;
      child._child_ofs_field._0_4_ = (int)child._child_ofs_field + 1;
    }
    iVar4 = b_tree_node::_child_ofs((b_tree_node *)local_90,(uint16_t)child._child_ofs_field);
    b_tree_node::b_tree_node((b_tree_node *)local_108,&this->_p,iVar4);
    uVar3 = b_tree_node::_num_keys((b_tree_node *)local_108);
    if ((uint)uVar3 == (uint)this->_min_degree * 2 - 1) {
      printf("split child ofs\n");
      iVar1 = (int)child._child_ofs_field;
      iVar4 = b_tree_node::_ofs((b_tree_node *)local_108);
      b_tree_node::_split_child((b_tree_node *)local_90,iVar1,iVar4);
      iVar4 = b_tree_node::_key((b_tree_node *)local_90,(uint16_t)child._child_ofs_field);
      if (iVar4 < key) {
        child._child_ofs_field._0_4_ = (int)child._child_ofs_field + 1;
      }
    }
    iVar4 = b_tree_node::_child_ofs((b_tree_node *)local_90,(uint16_t)child._child_ofs_field);
    _insert_atomic_recursive(this,key,value,iVar4);
    b_tree_node::~b_tree_node((b_tree_node *)local_108);
  }
  b_tree_node::~b_tree_node((b_tree_node *)local_90);
  return;
}

Assistant:

void b_tree::_insert_atomic_recursive(int64_t key, int64_t value, int64_t node_ofs)
{
    b_tree_node node(_p, node_ofs);
    printf("%ld ", node._ofs());

    // If the node is a leaf, insert the key-value pair
    if (node._leaf())
        node._insert_non_full(key, value);
    else
    {
        // If the node is an internal node, find the appropriate child to descend into
        int i = 0;
        while (i < node._num_keys() && key > node._key(i))
            i++;

        b_tree_node child(_p, node._child_ofs(i));
        if (child._num_keys() == 2 * _min_degree - 1) {
            // If the child node is full, split it before descending
            printf("split child ofs\n");
            node._split_child(i, child._ofs());
            if (key > node._key(i))
                i++;
        }

        // Recursively insert the key-value pair into the appropriate child
        _insert_atomic_recursive(key, value, node._child_ofs(i));
    }
}